

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

string * __thiscall
cppforth::Forth::GetFileName
          (string *__return_storage_ptr__,Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  pointer pcVar2;
  char cVar3;
  pointer pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar1 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar4 = (this->OpenFiles).
                super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar4 != pFVar1; pFVar4 = pFVar4 + 1) {
    if ((pFVar4->FILE == handler) && (cVar3 = std::__basic_file<char>::is_open(), cVar3 != '\0'))
    goto LAB_0011e576;
  }
  __return_storage_ptr__ = &local_50;
  std::operator+(__return_storage_ptr__,function,": wrong file handler access");
  throwMessage(this,__return_storage_ptr__,ec);
  std::__cxx11::string::~string((string *)&local_50);
  __cxa_rethrow();
LAB_0011e576:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pFVar4->fileName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pFVar4->fileName)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileName(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileName;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}